

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall QColumnView::initializeColumn(QColumnView *this,QAbstractItemView *column)

{
  long lVar1;
  bool bVar2;
  QAbstractItemModel *pQVar3;
  DragDropMode *pDVar4;
  QAbstractItemDelegate *pQVar5;
  QAbstractItemView *in_RSI;
  long in_FS_OFFSET;
  QAbstractItemDelegate *delegate;
  QColumnViewPrivate *d;
  const_iterator end;
  const_iterator i;
  undefined4 in_stack_ffffffffffffff18;
  SelectionBehavior in_stack_ffffffffffffff1c;
  QAbstractItemView *in_stack_ffffffffffffff20;
  QSize *in_stack_ffffffffffffff28;
  QAbstractItemView *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  DragDropMode in_stack_ffffffffffffff3c;
  QWidget *in_stack_ffffffffffffff40;
  QAbstractItemView *pQVar6;
  QAbstractItemView *this_00;
  undefined8 in_stack_ffffffffffffff80;
  QWidget *in_stack_ffffffffffffff88;
  QAbstractItemView *pQVar7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QColumnView *)0x864e91);
  QFrame::setFrameShape
            ((QFrame *)in_stack_ffffffffffffff30,(Shape)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  QAbstractScrollArea::setHorizontalScrollBarPolicy
            (&in_stack_ffffffffffffff30->super_QAbstractScrollArea,
             (ScrollBarPolicy)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  QAbstractScrollArea::setVerticalScrollBarPolicy
            (&in_stack_ffffffffffffff30->super_QAbstractScrollArea,
             (ScrollBarPolicy)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  QWidget::setMinimumWidth(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  QWidget::setAttribute
            (in_stack_ffffffffffffff88,(WidgetAttribute)((ulong)in_stack_ffffffffffffff80 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff80 >> 0x18,0));
  pQVar6 = in_RSI;
  QAbstractItemView::dragDropMode((QAbstractItemView *)in_stack_ffffffffffffff28);
  QAbstractItemView::setDragDropMode(pQVar6,in_stack_ffffffffffffff3c);
  pQVar6 = in_RSI;
  QAbstractItemView::dragDropOverwriteMode(in_stack_ffffffffffffff20);
  QAbstractItemView::setDragDropOverwriteMode
            (in_stack_ffffffffffffff20,SUB41(in_stack_ffffffffffffff1c >> 0x18,0));
  this_00 = in_RSI;
  QAbstractItemView::showDropIndicator(in_stack_ffffffffffffff20);
  QAbstractItemView::setDropIndicatorShown
            (in_stack_ffffffffffffff20,SUB41(in_stack_ffffffffffffff1c >> 0x18,0));
  QAbstractItemView::alternatingRowColors(in_stack_ffffffffffffff20);
  QAbstractItemView::setAlternatingRowColors
            (in_stack_ffffffffffffff30,SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0));
  QAbstractItemView::hasAutoScroll(in_stack_ffffffffffffff20);
  QAbstractItemView::setAutoScroll
            (in_stack_ffffffffffffff20,SUB41(in_stack_ffffffffffffff1c >> 0x18,0));
  QAbstractItemView::editTriggers(in_stack_ffffffffffffff20);
  QAbstractItemView::setEditTriggers
            (in_stack_ffffffffffffff20,
             (QFlagsStorageHelper<QAbstractItemView::EditTrigger,_4>)
             SUB84((ulong)in_stack_ffffffffffffff28 >> 0x20,0));
  QAbstractItemView::horizontalScrollMode(in_stack_ffffffffffffff20);
  QAbstractItemView::setHorizontalScrollMode
            (in_stack_ffffffffffffff30,(ScrollMode)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  QAbstractItemView::iconSize(in_stack_ffffffffffffff20);
  QAbstractItemView::setIconSize(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  QAbstractItemView::selectionBehavior(in_stack_ffffffffffffff20);
  QAbstractItemView::setSelectionBehavior(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  pQVar7 = in_RSI;
  QAbstractItemView::selectionMode(in_stack_ffffffffffffff20);
  QAbstractItemView::setSelectionMode(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  QAbstractItemView::tabKeyNavigation(in_stack_ffffffffffffff20);
  QAbstractItemView::setTabKeyNavigation
            (in_stack_ffffffffffffff20,SUB41(in_stack_ffffffffffffff1c >> 0x18,0));
  QAbstractItemView::textElideMode((QAbstractItemView *)0x8650df);
  QAbstractItemView::setTextElideMode(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  QAbstractItemView::verticalScrollMode(in_stack_ffffffffffffff20);
  QAbstractItemView::setVerticalScrollMode
            ((QAbstractItemView *)in_stack_ffffffffffffff28,
             (ScrollMode)((ulong)in_stack_ffffffffffffff20 >> 0x20));
  pQVar3 = QAbstractItemView::model(in_stack_ffffffffffffff30);
  (**(code **)(*(long *)&(in_RSI->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x1c8))
            (in_RSI,pQVar3);
  QMap<int,_QPointer<QAbstractItemDelegate>_>::cbegin
            ((QMap<int,_QPointer<QAbstractItemDelegate>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  QMap<int,_QPointer<QAbstractItemDelegate>_>::cend
            ((QMap<int,_QPointer<QAbstractItemDelegate>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  while( true ) {
    bVar2 = ::operator!=((const_iterator *)in_stack_ffffffffffffff20,
                         (const_iterator *)
                         CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    if (!bVar2) break;
    in_stack_ffffffffffffff30 = in_RSI;
    pDVar4 = (DragDropMode *)
             QMap<int,_QPointer<QAbstractItemDelegate>_>::const_iterator::key
                       ((const_iterator *)0x8651d6);
    in_stack_ffffffffffffff3c = *pDVar4;
    QMap<int,_QPointer<QAbstractItemDelegate>_>::const_iterator::value((const_iterator *)0x8651e9);
    ::QPointer::operator_cast_to_QAbstractItemDelegate_((QPointer<QAbstractItemDelegate> *)0x8651f1)
    ;
    QAbstractItemView::setItemDelegateForRow
              (this_00,(int)((ulong)pQVar7 >> 0x20),(QAbstractItemDelegate *)pQVar6);
    QMap<int,_QPointer<QAbstractItemDelegate>_>::const_iterator::operator++
              ((const_iterator *)in_stack_ffffffffffffff20);
  }
  pQVar5 = QAbstractItemView::itemDelegate((QAbstractItemView *)0x86521e);
  ::QPointer::operator_cast_to_QAbstractItemDelegate_((QPointer<QAbstractItemDelegate> *)0x865247);
  QAbstractItemView::setItemDelegate
            (in_stack_ffffffffffffff30,
             (QAbstractItemDelegate *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
  ;
  if (pQVar5 != (QAbstractItemDelegate *)0x0) {
    (**(code **)(*(long *)pQVar5 + 0x20))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnView::initializeColumn(QAbstractItemView *column) const
{
    Q_D(const QColumnView);

    column->setFrameShape(QFrame::NoFrame);
    column->setHorizontalScrollBarPolicy(Qt::ScrollBarAlwaysOff);
    column->setVerticalScrollBarPolicy(Qt::ScrollBarAlwaysOn);
    column->setMinimumWidth(100);
    column->setAttribute(Qt::WA_MacShowFocusRect, false);

#if QT_CONFIG(draganddrop)
    column->setDragDropMode(dragDropMode());
    column->setDragDropOverwriteMode(dragDropOverwriteMode());
    column->setDropIndicatorShown(showDropIndicator());
#endif
    column->setAlternatingRowColors(alternatingRowColors());
    column->setAutoScroll(hasAutoScroll());
    column->setEditTriggers(editTriggers());
    column->setHorizontalScrollMode(horizontalScrollMode());
    column->setIconSize(iconSize());
    column->setSelectionBehavior(selectionBehavior());
    column->setSelectionMode(selectionMode());
    column->setTabKeyNavigation(tabKeyNavigation());
    column->setTextElideMode(textElideMode());
    column->setVerticalScrollMode(verticalScrollMode());

    column->setModel(model());

    // Copy the custom delegate per row
    for (auto i = d->rowDelegates.cbegin(), end = d->rowDelegates.cend(); i != end; ++i)
        column->setItemDelegateForRow(i.key(), i.value());

    // set the delegate to be the columnview delegate
    QAbstractItemDelegate *delegate = column->itemDelegate();
    column->setItemDelegate(d->itemDelegate);
    delete delegate;
}